

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

Acb_Man_t *
Acb_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  Acb_Man_t *pAVar1;
  char *pcVar2;
  Hash_IntMan_t *local_60;
  Abc_Nam_t *local_58;
  Abc_Nam_t *local_50;
  Abc_Nam_t *local_48;
  Acb_Man_t *pNew;
  Hash_IntMan_t *vHash_local;
  Abc_Nam_t *pMods_local;
  Abc_Nam_t *pFuns_local;
  Abc_Nam_t *pStrs_local;
  int nNtks_local;
  char *pFileName_local;
  
  pAVar1 = (Acb_Man_t *)calloc(1,0x6e8);
  pcVar2 = Extra_FileDesignName(pFileName);
  pAVar1->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(pFileName);
  pAVar1->pSpec = pcVar2;
  local_48 = pStrs;
  if (pStrs == (Abc_Nam_t *)0x0) {
    local_48 = Abc_NamStart(1000,0x18);
  }
  pAVar1->pStrs = local_48;
  local_50 = pFuns;
  if (pFuns == (Abc_Nam_t *)0x0) {
    local_50 = Abc_NamStart(100,0x18);
  }
  pAVar1->pFuns = local_50;
  local_58 = pMods;
  if (pMods == (Abc_Nam_t *)0x0) {
    local_58 = Abc_NamStart(100,0x18);
  }
  pAVar1->pMods = local_58;
  local_60 = vHash;
  if (vHash == (Hash_IntMan_t *)0x0) {
    local_60 = Hash_IntManStart(1000);
  }
  pAVar1->vHash = local_60;
  if (pFuns == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(pAVar1->pFuns,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar1->pFuns,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar1->pFuns,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(pAVar1->pFuns,"1\'bz",(int *)0x0);
  }
  Vec_PtrGrow(&pAVar1->vNtks,nNtks + 1);
  Vec_PtrPush(&pAVar1->vNtks,(void *)0x0);
  pAVar1->iRoot = 1;
  return pAVar1;
}

Assistant:

static inline Acb_Man_t * Acb_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Acb_Man_t * pNew = ABC_CALLOC( Acb_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}